

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Random_keys.cpp
# Opt level: O0

void __thiscall Random_keys::geraPopAleatoria(Random_keys *this,Graph *g)

{
  int iVar1;
  int iVar2;
  RK_Individual *this_00;
  int local_24;
  RK_Individual *pRStack_20;
  int i;
  RK_Individual *ind;
  Graph *g_local;
  Random_keys *this_local;
  
  ind = (RK_Individual *)g;
  g_local = (Graph *)this;
  Graph::markOneDirectionInEdges(g);
  for (local_24 = 0; local_24 < this->tamPop; local_24 = local_24 + 1) {
    this_00 = (RK_Individual *)operator_new(0x28);
    iVar1 = Graph::getEdgesSizes((Graph *)ind);
    iVar2 = Graph::getNumberOfNonModifiable((Graph *)ind);
    RK_Individual::RK_Individual(this_00,iVar1 / 2 - iVar2);
    pRStack_20 = this_00;
    RK_Individual::generate_random_weights(this_00);
    std::vector<RK_Individual_*,_std::allocator<RK_Individual_*>_>::push_back
              (&this->popAtual,&stack0xffffffffffffffe0);
  }
  std::vector<RK_Individual_*,_std::allocator<RK_Individual_*>_>::operator=
            (&this->popAnterior,&this->popAtual);
  return;
}

Assistant:

void Random_keys::geraPopAleatoria(Graph *g){

    g->markOneDirectionInEdges();
    RK_Individual *ind;
    for(int i=0; i<this->tamPop; i++){

        ind = new RK_Individual(g->getEdgesSizes() / 2 - g->getNumberOfNonModifiable());
        ind->generate_random_weights();

        popAtual.push_back(ind);
    }
    popAnterior = popAtual;
}